

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O3

partSizeData *
initAndReadDeepScanLine
          (partSizeData *__return_storage_ptr__,vector<int,_std::allocator<int>_> *sampleCount,
          vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          *sampleData,
          vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
          *pixelPtrs,DeepFrameBuffer *buf,DeepScanLineInputPart *in,
          vector<int,_std::allocator<int>_> *inputSampleCount,Header *outHeader,
          vector<double,_std::allocator<double>_> *countPerf,
          vector<double,_std::allocator<double>_> *samplePerf)

{
  int iVar1;
  iterator iVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  int iVar4;
  int *piVar5;
  Header *h;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  Compression *pCVar8;
  size_type sVar9;
  size_type __new_size;
  long lVar10;
  long lVar11;
  int iVar12;
  size_type __new_size_00;
  long lVar13;
  long local_c0;
  double local_68 [7];
  
  Imf_3_4::DeepScanLineInputPart::header();
  piVar5 = (int *)Imf_3_4::Header::dataWindow();
  iVar12 = *piVar5;
  iVar1 = piVar5[1];
  lVar10 = (long)((piVar5[2] - iVar12) + 1);
  __new_size_00 = ((piVar5[3] - iVar1) + 1) * lVar10;
  h = (Header *)Imf_3_4::DeepScanLineInputPart::header();
  iVar4 = channelCount(h);
  std::vector<int,_std::allocator<int>_>::resize(sampleCount,__new_size_00);
  lVar13 = iVar1 * lVar10 + (long)iVar12;
  __new_size = (size_type)iVar4;
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::resize(pixelPtrs,__new_size);
  Imf_3_4::Slice::Slice
            ((Slice *)local_68,UINT,
             (char *)((sampleCount->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start + -lVar13),4,lVar10 * 4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)buf);
  Imf_3_4::Header::channels();
  p_Var6 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
  Imf_3_4::Header::channels();
  p_Var7 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
  if (p_Var6 == p_Var7) {
    local_c0 = 0;
  }
  else {
    lVar11 = 0;
    iVar12 = 0;
    do {
      std::vector<char_*,_std::allocator<char_*>_>::resize
                ((vector<char_*,_std::allocator<char_*>_> *)
                 ((long)&(((pixelPtrs->
                           super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
                         super__Vector_impl_data + lVar11),__new_size_00);
      iVar4 = Imf_3_4::pixelTypeSize(p_Var6[9]._M_color);
      Imf_3_4::DeepSlice::DeepSlice
                ((DeepSlice *)local_68,p_Var6[9]._M_color,
                 (char *)(*(long *)((long)&(((pixelPtrs->
                                             super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<char_*,_std::allocator<char_*>_>).
                                           _M_impl.super__Vector_impl_data + lVar11) + lVar13 * -8),
                 8,lVar10 << 3,(long)iVar4,1,1,0.0,false,false);
      Imf_3_4::DeepFrameBuffer::insert((char *)buf,(DeepSlice *)(p_Var6 + 1));
      iVar12 = iVar12 + iVar4;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      Imf_3_4::Header::channels();
      p_Var7 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
      lVar11 = lVar11 + 0x18;
    } while (p_Var6 != p_Var7);
    local_c0 = (long)iVar12;
  }
  pvVar3 = inputSampleCount;
  if (inputSampleCount == (vector<int,_std::allocator<int>_> *)0x0) {
    Imf_3_4::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)in);
    lVar10 = std::chrono::_V2::steady_clock::now();
    Imf_3_4::DeepScanLineInputPart::readPixelSampleCounts((int)in,iVar1);
    lVar13 = std::chrono::_V2::steady_clock::now();
    local_68[0] = (double)(lVar13 - lVar10) / 1000000000.0;
    iVar2._M_current =
         (countPerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    pvVar3 = sampleCount;
    if (iVar2._M_current ==
        (countPerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (countPerf,iVar2,local_68);
    }
    else {
      *iVar2._M_current = local_68[0];
      (countPerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  lVar10 = 0;
  for (piVar5 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 != (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish; piVar5 = piVar5 + 1) {
    lVar10 = lVar10 + *piVar5;
  }
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::resize(sampleData,__new_size);
  Imf_3_4::DeepScanLineInputPart::header();
  Imf_3_4::Header::channels();
  p_Var6 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
  Imf_3_4::DeepScanLineInputPart::header();
  Imf_3_4::Header::channels();
  p_Var7 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
  if (p_Var6 != p_Var7) {
    lVar13 = 0;
    do {
      iVar12 = Imf_3_4::pixelTypeSize(p_Var6[9]._M_color);
      std::vector<char,_std::allocator<char>_>::resize
                ((sampleData->
                 super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar13,iVar12 * lVar10);
      if (__new_size_00 != 0) {
        iVar4 = 0;
        sVar9 = 0;
        do {
          *(long *)(*(long *)&(pixelPtrs->
                              super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[lVar13].
                              super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                              super__Vector_impl_data + sVar9 * 8) =
               (long)(iVar4 * iVar12) +
               *(long *)&(sampleData->
                         super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[lVar13].
                         super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data;
          iVar4 = iVar4 + (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[sVar9];
          sVar9 = sVar9 + 1;
        } while (__new_size_00 != sVar9);
      }
      lVar13 = lVar13 + 1;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      Imf_3_4::DeepScanLineInputPart::header();
      Imf_3_4::Header::channels();
      p_Var7 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
    } while (p_Var6 != p_Var7);
  }
  if (inputSampleCount == (vector<int,_std::allocator<int>_> *)0x0) {
    lVar13 = std::chrono::_V2::steady_clock::now();
    Imf_3_4::DeepScanLineInputPart::readPixels((int)in,iVar1);
    lVar11 = std::chrono::_V2::steady_clock::now();
    local_68[0] = (double)(lVar11 - lVar13) / 1000000000.0;
    iVar2._M_current =
         (samplePerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (samplePerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (samplePerf,iVar2,local_68);
    }
    else {
      *iVar2._M_current = local_68[0];
      (samplePerf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  __return_storage_ptr__->channelCount = 0;
  __return_storage_ptr__->tileCount = 0;
  __return_storage_ptr__->isDeep = false;
  __return_storage_ptr__->isTiled = false;
  __return_storage_ptr__->compression = NUM_COMPRESSION_METHODS;
  (__return_storage_ptr__->partType)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->partType).field_2;
  (__return_storage_ptr__->partType)._M_string_length = 0;
  (__return_storage_ptr__->partType).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->pixelCount = __new_size_00;
  __return_storage_ptr__->rawSize = lVar10 * local_c0 + __new_size_00 * 4;
  __return_storage_ptr__->isDeep = true;
  Imf_3_4::DeepScanLineInputPart::header();
  Imf_3_4::Header::type_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->partType);
  Imf_3_4::DeepScanLineInputPart::header();
  pCVar8 = (Compression *)Imf_3_4::Header::compression();
  __return_storage_ptr__->compression = *pCVar8;
  __return_storage_ptr__->channelCount = __new_size;
  return __return_storage_ptr__;
}

Assistant:

partSizeData
initAndReadDeepScanLine (
    vector<int>&           sampleCount,
    vector<vector<char>>&  sampleData,
    vector<vector<char*>>& pixelPtrs,
    DeepFrameBuffer&       buf,
    DeepScanLineInputPart& in,
    const vector<int>*     inputSampleCount,
    const Header&          outHeader,
    vector<double>&        countPerf,
    vector<double>&        samplePerf)
{
    Box2i    dw        = in.header ().dataWindow ();
    uint64_t width     = dw.max.x + 1 - dw.min.x;
    uint64_t height    = dw.max.y + 1 - dw.min.y;
    uint64_t numPixels = width * height;
    int      numChans  = channelCount (in.header ());
    sampleCount.resize (numPixels);

    uint64_t offsetToOrigin = width * static_cast<uint64_t> (dw.min.y) +
                              static_cast<uint64_t> (dw.min.x);

    pixelPtrs.resize (numChans);

    buf.insertSampleCountSlice (Slice (
        UINT,
        (char*) (sampleCount.data () - offsetToOrigin),
        sizeof (int),
        sizeof (int) * width));
    int channelNumber  = 0;
    int bytesPerSample = 0;
    for (ChannelList::ConstIterator i = outHeader.channels ().begin ();
         i != outHeader.channels ().end ();
         ++i)
    {
        pixelPtrs[channelNumber].resize (numPixels);
        int samplesize = pixelTypeSize (i.channel ().type);
        buf.insert (
            i.name (),
            DeepSlice (
                i.channel ().type,
                (char*) (pixelPtrs[channelNumber].data () - offsetToOrigin),
                sizeof (char*),
                sizeof (char*) * width,
                samplesize));
        ++channelNumber;
        bytesPerSample += samplesize;
    }

    const vector<int>& samples = inputSampleCount ? *inputSampleCount
                                                  : sampleCount;
    if (!inputSampleCount)
    {
        in.setFrameBuffer (buf);

        steady_clock::time_point startCountRead = steady_clock::now ();
        in.readPixelSampleCounts (dw.min.y, dw.max.y);
        steady_clock::time_point endCountRead = steady_clock::now ();

        countPerf.push_back (timing (startCountRead, endCountRead));
    }

    size_t totalSamples = 0;

    for (int i: samples)
    {
        totalSamples += i;
    }

    sampleData.resize (numChans);
    channelNumber = 0;
    for (ChannelList::ConstIterator i = in.header ().channels ().begin ();
         i != in.header ().channels ().end ();
         ++i)
    {
        int samplesize = pixelTypeSize (i.channel ().type);
        sampleData[channelNumber].resize (samplesize * totalSamples);
        int offset = 0;
        for (uint64_t p = 0; p < numPixels; ++p)
        {
            pixelPtrs[channelNumber][p] =
                sampleData[channelNumber].data () + offset * samplesize;
            offset += samples[p];
        }

        ++channelNumber;
    }

    if (!inputSampleCount)
    {

        steady_clock::time_point startSampleRead = steady_clock::now ();
        in.readPixels (dw.min.y, dw.max.y);
        steady_clock::time_point endSampleRead = steady_clock::now ();
        samplePerf.push_back (timing (startSampleRead, endSampleRead));
    }

    partSizeData data;
    data.pixelCount = numPixels;

    //raw size includes the sample count table
    data.rawSize     = totalSamples * bytesPerSample + numPixels * sizeof (int);
    data.isDeep      = true;
    data.partType    = in.header ().type ();
    data.compression = in.header ().compression ();
    data.channelCount = numChans;

    return data;
}